

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

void * __thiscall
anon_unknown.dwarf_5f52c::CtorEvalExternalInterface::getMemory
          (CtorEvalExternalInterface *this,Address address,Name memoryName,size_t size)

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  string *psVar4;
  ulong __new_size;
  undefined1 local_58 [8];
  Name memoryName_local;
  long local_40;
  char local_38 [16];
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  local_58 = memoryName.super_IString.str._M_len;
  p_Var2 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->memories)._M_h,
                      memoryName_local.super_IString.str._M_len %
                      (this->memories)._M_h._M_bucket_count,(key_type *)local_58,
                      memoryName_local.super_IString.str._M_len);
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var2->_M_nxt, p_Var1 != (_Hash_node_base *)0x0)) {
    __new_size = size + address.addr;
    p_Var3 = p_Var1[3]._M_nxt;
    if ((ulong)((long)p_Var1[4]._M_nxt - (long)p_Var3) < __new_size) {
      if (this->MaximumMemory < __new_size) {
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        memoryName_local.super_IString.str._M_str = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&memoryName_local.super_IString.str._M_str,
                   "excessively high memory address accessed","");
        *(string **)psVar4 = psVar4 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  (psVar4,memoryName_local.super_IString.str._M_str,
                   memoryName_local.super_IString.str._M_str + local_40);
        __cxa_throw(psVar4,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)(p_Var1 + 3),__new_size);
      p_Var3 = (_Hash_node_base *)
               (((vector<char,_std::allocator<char>_> *)(p_Var1 + 3))->
               super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    return (void *)((long)&p_Var3->_M_nxt + address.addr);
  }
  __assert_fail("it != memories.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x1d3,
                "void *(anonymous namespace)::CtorEvalExternalInterface::getMemory(Address, Name, size_t)"
               );
}

Assistant:

void* getMemory(Address address, Name memoryName, size_t size) {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    // resize the memory buffer as needed.
    auto max = address + size;
    if (max > memory.size()) {
      if (max > MaximumMemory) {
        throw FailToEvalException("excessively high memory address accessed");
      }
      memory.resize(max);
    }
    return &memory[address];
  }